

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O3

void xLearn::check(DMatrix *matrix,bool has_label,bool has_field)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  ulong uVar4;
  index_t *expected;
  pointer pNVar5;
  AssertionResult gtest_ar;
  int n;
  int col_len;
  Message local_78;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  int local_54;
  undefined4 local_50;
  int local_4c;
  index_t *local_48;
  DMatrix *local_40;
  ulong local_38;
  
  local_50 = (undefined4)CONCAT71(in_register_00000031,has_label);
  local_48 = &matrix->row_length;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_70,"matrix.row_length","kNum_lines",local_48,&kNum_lines);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (*local_48 != 0) {
    uVar4 = 0;
    local_40 = matrix;
    do {
      if ((char)local_50 == '\0') {
        local_78.ss_.ptr_._0_4_ = 0xfffffffe;
        testing::internal::CmpHelperEQ<float,int>
                  (local_70,"matrix.Y[i]","-2",
                   (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar4,(int *)&local_78);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message(&local_78);
          pcVar3 = "";
          if (local_68.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x3d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_60,&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        local_78.ss_.ptr_._0_4_ = 1;
        testing::internal::CmpHelperEQ<float,int>
                  (local_70,"matrix.Y[i]","1",
                   (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar4,(int *)&local_78);
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message(&local_78);
          pcVar3 = "";
          if (local_68.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x3b,pcVar3);
          testing::internal::AssertHelper::operator=(&local_60,&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_70,"matrix.norm[i]","13.888889",
                 (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4],13.888889);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message(&local_78);
        pcVar3 = "";
        if (local_68.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x3f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_60,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pvVar1 = (matrix->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4];
      local_78.ss_.ptr_._0_4_ = 5;
      local_4c = (int)((ulong)((long)*(pointer *)
                                      ((long)&(pvVar1->
                                              super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>
                                              )._M_impl.super__Vector_impl_data + 8) -
                              *(long *)&(pvVar1->
                                        super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>
                                        )._M_impl.super__Vector_impl_data) >> 2) * -0x55555555;
      testing::internal::CmpHelperEQ<int,int>(local_70,"col_len","5",&local_4c,(int *)&local_78);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message(&local_78);
        pcVar3 = "";
        if (local_68.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x41,pcVar3);
        testing::internal::AssertHelper::operator=(&local_60,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pvVar1 = (matrix->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4];
      local_54 = 0;
      pNVar5 = (pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = uVar4;
      if (pNVar5 != *(pointer *)
                     ((long)&(pvVar1->
                             super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                             _M_impl.super__Vector_impl_data + 8)) {
        expected = &pNVar5->feat_id;
        do {
          if (has_field) {
            testing::internal::CmpHelperEQ<unsigned_int,int>
                      (local_70,"iter->field_id","n",(uint *)(expected + -1),&local_54);
            if (local_70[0] == (internal)0x0) {
              testing::Message::Message(&local_78);
              pcVar3 = "";
              if (local_68.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                         ,0x47,pcVar3);
              testing::internal::AssertHelper::operator=(&local_60,&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0
                   )) {
                  (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) +
                              8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_68,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            local_78.ss_.ptr_._0_4_ = 0;
            testing::internal::CmpHelperEQ<unsigned_int,int>
                      (local_70,"iter->field_id","0",(uint *)(expected + -1),(int *)&local_78);
            if (local_70[0] == (internal)0x0) {
              testing::Message::Message(&local_78);
              pcVar3 = "";
              if (local_68.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_60,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                         ,0x49,pcVar3);
              testing::internal::AssertHelper::operator=(&local_60,&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_60);
              if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) &&
                   ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0
                   )) {
                  (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) +
                              8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_68,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    (local_70,"iter->feat_id","n",expected,&local_54);
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message(&local_78);
            pcVar3 = "";
            if (local_68.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                       ,0x4b,pcVar3);
            testing::internal::AssertHelper::operator=(&local_60,&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_70,"iter->feat_val","0.12",(float)expected[1],0.12);
          if (local_70[0] == (internal)0x0) {
            testing::Message::Message(&local_78);
            pcVar3 = "";
            if (local_68.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                       ,0x4c,pcVar3);
            testing::internal::AssertHelper::operator=(&local_60,&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_54 = local_54 + 1;
          pNVar5 = (pointer)(expected + 2);
          expected = expected + 3;
        } while (pNVar5 != *(pointer *)
                            ((long)&(pvVar1->
                                    super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)
                                    ._M_impl.super__Vector_impl_data + 8));
      }
      local_78.ss_.ptr_._0_4_ = 5;
      testing::internal::CmpHelperEQ<int,int>(local_70,"n","5",&local_54,(int *)&local_78);
      uVar4 = local_38;
      matrix = local_40;
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message(&local_78);
        pcVar3 = "";
        if (local_68.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((local_68.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x4f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_60,&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *local_48);
  }
  return;
}

Assistant:

void check(const DMatrix& matrix, bool has_label, bool has_field) {
  EXPECT_EQ(matrix.row_length, kNum_lines);
  for (index_t i = 0; i < matrix.row_length; ++i) {
    if (has_label) {
      EXPECT_EQ(matrix.Y[i], 1);
    } else {
      EXPECT_EQ(matrix.Y[i], -2);
    }
    EXPECT_FLOAT_EQ(matrix.norm[i], 13.888889);
    int col_len = matrix.row[i]->size();
    EXPECT_EQ(col_len, 5);
    SparseRow *row = matrix.row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      if (has_field) {
        EXPECT_EQ(iter->field_id, n);
      } else {
        EXPECT_EQ(iter->field_id, 0);
      }
      EXPECT_EQ(iter->feat_id, n);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.12);
      n++;
    }
    EXPECT_EQ(n, 5);
  }
}